

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.cpp
# Opt level: O0

void __thiscall
pstore::region::mem_based_factory::mem_based_factory
          (mem_based_factory *this,shared_ptr<pstore::file::in_memory> *file,uint64_t full_size,
          uint64_t min_size)

{
  uint64_t min_size_local;
  uint64_t full_size_local;
  shared_ptr<pstore::file::in_memory> *file_local;
  mem_based_factory *this_local;
  
  factory::factory(&this->super_factory,full_size,min_size);
  (this->super_factory)._vptr_factory = (_func_int **)&PTR__mem_based_factory_001ba5b0;
  std::shared_ptr<pstore::file::in_memory>::shared_ptr(&this->file_,file);
  return;
}

Assistant:

mem_based_factory::mem_based_factory (std::shared_ptr<file::in_memory> file,
                                              std::uint64_t const full_size,
                                              std::uint64_t const min_size)
                : factory{full_size, min_size}
                , file_{std::move (file)} {}